

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
ADPlanner::GetSearchPath(ADPlanner *this,ADSearchStateSpace_t *pSearchStateSpace,int *solcost)

{
  long lVar1;
  int iVar2;
  undefined8 uVar3;
  size_type sVar4;
  char *what_arg;
  int *in_RCX;
  long in_RDX;
  long *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  char *msg;
  int i;
  int actioncost;
  int max_steps;
  int steps;
  FILE *fOut;
  CMDPSTATE *startstate;
  CMDPSTATE *goalstate;
  CMDPSTATE *state;
  ADState *searchstateinfo;
  vector<int,_std::allocator<int>_> CostV;
  vector<int,_std::allocator<int>_> SuccIDV;
  vector<int,_std::allocator<int>_> *wholePathIds;
  char *in_stack_ffffffffffffff08;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff10;
  reference in_stack_ffffffffffffff18;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff20;
  int local_a0;
  int local_9c;
  int local_94;
  int *local_78;
  int *local_70;
  int *local_68;
  undefined1 local_50 [24];
  vector<int,_std::allocator<int>_> local_38;
  int *local_20;
  long local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x193f2e);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x193f3b);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x193f4d);
  if ((*(byte *)(in_RSI + 0xe) & 1) == 0) {
    local_78 = *(int **)(local_18 + 0x28);
    local_70 = *(int **)(local_18 + 0x30);
  }
  else {
    local_78 = *(int **)(local_18 + 0x30);
    local_70 = *(int **)(local_18 + 0x28);
    iVar2 = (**(code **)(*in_RSI + 0x180))(in_RSI,local_18);
    if (iVar2 != 1) {
      *local_20 = 1000000000;
      goto LAB_0019439b;
    }
  }
  local_68 = local_78;
  std::vector<int,_std::allocator<int>_>::push_back
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  *local_20 = 0;
  if (_stdout == 0) {
    uVar3 = __cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              ((SBPL_Exception *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    __cxa_throw(uVar3,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  local_94 = 0;
  while ((((*local_68 != *local_70 && local_94 < 100000 &&
           (local_94 = local_94 + 1, *(long *)(local_68 + 0xe) != 0)) &&
          (lVar1 = *(long *)(local_68 + 0xe), *(long *)(lVar1 + 0x38) != 0)) &&
         (*(int *)(lVar1 + 0x24) != 1000000000))) {
    (**(code **)(*(long *)in_RSI[1] + 0x28))((long *)in_RSI[1],*local_68,&local_38,local_50);
    local_9c = 1000000000;
    for (local_a0 = 0; sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_38),
        local_a0 < (int)sVar4; local_a0 = local_a0 + 1) {
      in_stack_ffffffffffffff20 =
           (vector<int,_std::allocator<int>_> *)
           std::vector<int,_std::allocator<int>_>::at
                     (in_stack_ffffffffffffff10,(size_type)in_stack_ffffffffffffff08);
      if ((*(int *)&(in_stack_ffffffffffffff20->super__Vector_base<int,_std::allocator<int>_>).
                    _M_impl.super__Vector_impl_data._M_start == **(int **)(lVar1 + 0x38)) &&
         (in_stack_ffffffffffffff18 =
               std::vector<int,_std::allocator<int>_>::at
                         (in_stack_ffffffffffffff10,(size_type)in_stack_ffffffffffffff08),
         *in_stack_ffffffffffffff18 < local_9c)) {
        in_stack_ffffffffffffff10 =
             (vector<int,_std::allocator<int>_> *)
             std::vector<int,_std::allocator<int>_>::at
                       (in_stack_ffffffffffffff10,(size_type)in_stack_ffffffffffffff08);
        local_9c = *(int *)&(in_stack_ffffffffffffff10->
                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start;
      }
    }
    *local_20 = local_9c + *local_20;
    if (*(uint *)(lVar1 + 0x20) < *(uint *)(lVar1 + 0x24)) {
      (**(code **)(*in_RSI + 0x188))(in_RSI,lVar1,_stdout);
      what_arg = (char *)__cxa_allocate_exception(0x10);
      SBPL_Exception::SBPL_Exception((SBPL_Exception *)in_stack_ffffffffffffff10,what_arg);
      __cxa_throw(what_arg,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
    }
    local_68 = *(int **)(lVar1 + 0x38);
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  if (*local_68 != *local_70) {
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x19436b);
    *local_20 = 1000000000;
  }
LAB_0019439b:
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff20);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff20);
  return in_RDI;
}

Assistant:

vector<int> ADPlanner::GetSearchPath(ADSearchStateSpace_t* pSearchStateSpace, int& solcost)
{
    vector<int> SuccIDV;
    vector<int> CostV;
    vector<int> wholePathIds;
    ADState* searchstateinfo;
    CMDPSTATE* state = NULL;
    CMDPSTATE* goalstate = NULL;
    CMDPSTATE* startstate = NULL;

    if (bforwardsearch) {
        startstate = pSearchStateSpace->searchstartstate;
        goalstate = pSearchStateSpace->searchgoalstate;

        //reconstruct the path by setting bestnextstate pointers appropriately
        if (ReconstructPath(pSearchStateSpace) != 1) {
            solcost = INFINITECOST;
            return wholePathIds;
        }
    }
    else {
        startstate = pSearchStateSpace->searchgoalstate;
        goalstate = pSearchStateSpace->searchstartstate;
    }

#if DEBUG
    //PrintSearchPath(pSearchStateSpace, fDeb);
#endif

    state = startstate;

    wholePathIds.push_back(state->StateID);
    solcost = 0;

    FILE* fOut = stdout;
    if (fOut == NULL) {
        throw SBPL_Exception("ERROR: could not open file");
    }
    int steps = 0;
    const int max_steps = 100000;
    while (state->StateID != goalstate->StateID && steps < max_steps) {
        steps++;

        if (state->PlannerSpecificData == NULL) {
            SBPL_FPRINTF(fOut, "path does not exist since search data does not exist\n");
            break;
        }

        searchstateinfo = (ADState*)state->PlannerSpecificData;

        if (searchstateinfo->bestnextstate == NULL) {
            SBPL_FPRINTF(fOut, "path does not exist since bestnextstate == NULL\n");
            break;
        }
        if (searchstateinfo->g == INFINITECOST) {
            SBPL_FPRINTF(fOut, "path does not exist since bestnextstate == NULL\n");
            break;
        }

        environment_->GetSuccs(state->StateID, &SuccIDV, &CostV);
        int actioncost = INFINITECOST;
        for (int i = 0; i < (int)SuccIDV.size(); i++) {
            if (SuccIDV.at(i) == searchstateinfo->bestnextstate->StateID && CostV.at(i) < actioncost) actioncost
                = CostV.at(i);

        }
        solcost += actioncost;

        if (searchstateinfo->v < searchstateinfo->g) {
            const char* msg = "ERROR: underconsistent state on the path";
            SBPL_ERROR("%s\n", msg);
            PrintSearchState(searchstateinfo, stdout);
            //SBPL_FPRINTF(fDeb, "ERROR: underconsistent state on the path\n");
            //PrintSearchState(searchstateinfo, fDeb);
            throw SBPL_Exception(msg);
        }

        //SBPL_FPRINTF(fDeb, "actioncost=%d between states %d and %d\n",
        //        actioncost, state->StateID, searchstateinfo->bestnextstate->StateID);
        //environment_->PrintState(state->StateID, false, fDeb);
        //environment_->PrintState(searchstateinfo->bestnextstate->StateID, false, fDeb);

        state = searchstateinfo->bestnextstate;

        wholePathIds.push_back(state->StateID);
    }

    if (state->StateID != goalstate->StateID) {
        SBPL_ERROR("ERROR: Failed to getsearchpath, steps processed=%d\n", steps);
        wholePathIds.clear();
        solcost = INFINITECOST;
        return wholePathIds;
    }

    //PrintSearchPath(pSearchStateSpace, stdout);

    return wholePathIds;
}